

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::Mine::ClearWireVertices(Mine *this,KUINT16 Index)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  
  iVar3 = getWire(this,Index);
  p_Var1 = iVar3._M_node[1]._M_parent;
  p_Var2 = iVar3._M_node[1]._M_left;
  p_Var4 = p_Var1;
  if (p_Var2 != p_Var1) {
    do {
      (*(code *)**(undefined8 **)p_Var4)(p_Var4);
      p_Var4 = (_Base_ptr)&p_Var4->_M_right;
    } while (p_Var4 != p_Var2);
    iVar3._M_node[1]._M_left = p_Var1;
  }
  return;
}

Assistant:

void Mine::ClearWireVertices(KUINT16 Index) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = getWire( Index );
    itr->second.clear();
}